

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::Impl::Impl
          (Impl *this,VatNetworkBase *network,Maybe<capnp::Capability::Client> *bootstrapInterface)

{
  SourceLocation location;
  SourceLocation location_00;
  Maybe<capnp::Capability::Client> *other;
  unsigned_long uVar1;
  SourceLocation local_80;
  undefined1 local_60 [24];
  undefined1 local_48 [40];
  Maybe<capnp::Capability::Client> *local_20;
  Maybe<capnp::Capability::Client> *bootstrapInterface_local;
  VatNetworkBase *network_local;
  Impl *this_local;
  
  local_20 = bootstrapInterface;
  bootstrapInterface_local = (Maybe<capnp::Capability::Client> *)network;
  network_local = (VatNetworkBase *)this;
  BootstrapFactoryBase::BootstrapFactoryBase(&this->super_BootstrapFactoryBase);
  kj::TaskSet::ErrorHandler::ErrorHandler(&this->super_ErrorHandler);
  (this->super_BootstrapFactoryBase)._vptr_BootstrapFactoryBase =
       (_func_int **)&PTR_baseCreateFor_00d8d6a0;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00d8d6c0;
  this->network = (VatNetworkBase *)bootstrapInterface_local;
  other = kj::mv<kj::Maybe<capnp::Capability::Client>>(bootstrapInterface);
  kj::Maybe<capnp::Capability::Client>::Maybe(&this->bootstrapInterface,other);
  this->bootstrapFactory = &this->super_BootstrapFactoryBase;
  uVar1 = kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
  this->flowLimit = uVar1;
  kj::Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_>::Maybe(&this->traceEncoder);
  kj::Promise<void>::Promise(&this->acceptLoopPromise,(void *)0x0);
  kj::refcounted<capnp::_::(anonymous_namespace)::RpcSystemBrand>();
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,"Impl",0x11a4,0x22);
  location.function = (char *)local_48._8_8_;
  location.fileName = (char *)local_48._0_8_;
  location.lineNumber = local_48._16_4_;
  location.columnNumber = local_48._20_4_;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler,location);
  kj::
  HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>_>
  ::HashMap(&this->connections);
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  acceptLoop((Impl *)local_60);
  kj::SourceLocation::SourceLocation
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,"Impl",0x11a5,0x19);
  location_00.function = local_80.function;
  location_00.fileName = local_80.fileName;
  location_00.lineNumber = local_80.lineNumber;
  location_00.columnNumber = local_80.columnNumber;
  kj::Promise<void>::
  eagerlyEvaluate<capnp::_::RpcSystemBase::Impl::Impl(capnp::_::VatNetworkBase&,kj::Maybe<capnp::Capability::Client>)::_lambda(kj::Exception&&)_1_>
            ((Promise<void> *)(local_60 + 8),(Type *)local_60,location_00);
  kj::Promise<void>::operator=(&this->acceptLoopPromise,(Promise<void> *)(local_60 + 8));
  kj::Promise<void>::~Promise((Promise<void> *)(local_60 + 8));
  kj::Promise<void>::~Promise((Promise<void> *)local_60);
  return;
}

Assistant:

Impl(VatNetworkBase& network, kj::Maybe<Capability::Client> bootstrapInterface)
      : network(network), bootstrapInterface(kj::mv(bootstrapInterface)),
        bootstrapFactory(*this), tasks(*this) {
    acceptLoopPromise = acceptLoop().eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
  }